

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O1

uint CalculateCRC(uint bufferCRC,size_t data)

{
  BOOL BVar1;
  uint uVar2;
  undefined8 uVar3;
  
  BVar1 = AutoSystemInfo::SSE4_2Available(&AutoSystemInfo::Data);
  if (BVar1 == 0) {
    uVar2 = (bufferCRC >> 8 | 0xff000000) ^ crc_32_tab[~((uint)data ^ bufferCRC) & 0xff];
  }
  else {
    uVar3 = crc32((ulong)bufferCRC,data);
    uVar2 = (uint)uVar3;
  }
  return uVar2;
}

Assistant:

uint CalculateCRC(uint bufferCRC, size_t data)
{
#if defined(_WIN32) || defined(__SSE4_2__)
#if defined(_M_IX86)
    if (AutoSystemInfo::Data.SSE4_2Available())
    {
        return _mm_crc32_u32(bufferCRC, data);
    }
#elif defined(_M_X64)
    if (AutoSystemInfo::Data.SSE4_2Available())
    {
        //CRC32 always returns a 32-bit result
        return (uint)_mm_crc32_u64(bufferCRC, data);
    }
#endif
#endif
    return CalculateCRC32(bufferCRC, data);
}